

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

mz_bool mz_zip_reader_extract_to_cfile
                  (mz_zip_archive *pZip,mz_uint file_index,FILE *pFile,mz_uint flags)

{
  mz_bool mVar1;
  mz_bool mVar2;
  mz_zip_archive_file_stat file_stat;
  mz_zip_archive_file_stat mStack_478;
  
  mVar1 = mz_zip_reader_file_stat(pZip,file_index,&mStack_478);
  mVar2 = 0;
  if (mVar1 != 0) {
    if ((mStack_478.m_is_directory == 0) && (mStack_478.m_is_supported != 0)) {
      mVar2 = mz_zip_reader_extract_to_callback
                        (pZip,file_index,mz_zip_file_write_callback,pFile,flags);
    }
    else if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
      mVar2 = 0;
    }
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_reader_extract_to_cfile(mz_zip_archive *pZip, mz_uint file_index, MZ_FILE *pFile, mz_uint flags)
{
    mz_zip_archive_file_stat file_stat;

    if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
        return MZ_FALSE;

    if ((file_stat.m_is_directory) || (!file_stat.m_is_supported))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

    return mz_zip_reader_extract_to_callback(pZip, file_index, mz_zip_file_write_callback, pFile, flags);
}